

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

int __thiscall
google::protobuf::Reflection::GetRepeatedEnumValue
          (Reflection *this,Message *message,FieldDescriptor *field,int index)

{
  CppType CVar1;
  int iVar2;
  int *piVar3;
  
  if (*(Descriptor **)(field + 0x50) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"GetRepeatedEnumValue","Field does not match message type.");
  }
  if (*(int *)(field + 0x3c) != 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"GetRepeatedEnumValue",
               "Field is singular; the method requires a repeated field.");
  }
  CVar1 = FieldDescriptor::cpp_type(field);
  if (CVar1 != CPPTYPE_ENUM) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"GetRepeatedEnumValue",CPPTYPE_ENUM);
  }
  if (field[0x42] == (FieldDescriptor)0x1) {
    iVar2 = internal::ExtensionSet::GetRepeatedEnum
                      ((ExtensionSet *)
                       ((long)&(message->super_MessageLite)._vptr_MessageLite +
                       (ulong)(uint)(this->schema_).extensions_offset_),*(int *)(field + 0x44),index
                      );
    return iVar2;
  }
  piVar3 = GetRepeatedField<int>(this,message,field,index);
  return *piVar3;
}

Assistant:

int Reflection::GetRepeatedEnumValue(const Message& message,
                                     const FieldDescriptor* field,
                                     int index) const {
  USAGE_CHECK_ALL(GetRepeatedEnumValue, REPEATED, ENUM);

  int value;
  if (field->is_extension()) {
    value = GetExtensionSet(message).GetRepeatedEnum(field->number(), index);
  } else {
    value = GetRepeatedField<int>(message, field, index);
  }
  return value;
}